

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDec.c
# Opt level: O0

void Abc_TruthReadHex(word *pTruth,char *pString,int nVars)

{
  char cVar1;
  int d;
  int local_38;
  char EndSymbol;
  int nDigits;
  int Digit;
  int k;
  int nWords;
  int nVars_local;
  char *pString_local;
  word *pTruth_local;
  
  if (nVars < 7) {
    local_38 = 1 << ((char)nVars - 2U & 0x1f);
  }
  else {
    local_38 = (1 << ((char)nVars - 6U & 0x1f)) << 4;
  }
  _nWords = pString;
  if ((*pString == '0') && (pString[1] == 'x')) {
    _nWords = pString + 2;
  }
  cVar1 = _nWords[local_38];
  if ((((cVar1 != ' ') && (cVar1 != '\n')) && (cVar1 != '\r')) && (cVar1 != '\0')) {
    __assert_fail("EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcRpo.c"
                  ,0x6d,"void Abc_TruthReadHex(word *, char *, int)");
  }
  nDigits = 0;
  while( true ) {
    if (local_38 <= nDigits) {
      return;
    }
    d = Abc_TruthReadHexDigit(_nWords[(local_38 + -1) - nDigits]);
    if ((d < 0) || (0xf < d)) break;
    Abc_TruthSetHex(pTruth,nDigits,d);
    nDigits = nDigits + 1;
  }
  __assert_fail("Digit >= 0 && Digit < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcRpo.c"
                ,0x72,"void Abc_TruthReadHex(word *, char *, int)");
}

Assistant:

void Abc_TruthReadHex( word * pTruth, char * pString, int nVars )
{
    int nWords = (nVars < 7)? 1 : (1 << (nVars-6));
    int k, Digit, nDigits = (nVars < 7) ? (1 << (nVars-2)) : (nWords << 4);
    char EndSymbol;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // get the last symbol
    EndSymbol = pString[nDigits];
    // the end symbol of the TT (the one immediately following hex digits)
    // should be one of the following: space, a new-line, or a zero-terminator
    // (note that on Windows symbols '\r' can be inserted before each '\n')
    assert( EndSymbol == ' ' || EndSymbol == '\n' || EndSymbol == '\r' || EndSymbol == '\0' );
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TruthReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TruthSetHex( pTruth, k, Digit );
    }
}